

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O0

int sptk::swipe::sieve(intvector ones)

{
  int iVar1;
  undefined4 *in_RSI;
  int in_EDI;
  __type __x;
  double dVar2;
  int j;
  int i;
  int sp;
  int k;
  int local_20;
  int local_1c;
  int local_14;
  
  local_14 = 0;
  __x = std::sqrt<int>(0);
  dVar2 = floor(__x);
  *in_RSI = 0;
  for (local_1c = 1; iVar1 = (int)dVar2, local_1c < (int)dVar2; local_1c = local_1c + 1) {
    if (in_RSI[local_1c] == 1) {
      for (local_20 = local_1c * 2 + 1; local_20 < in_EDI; local_20 = local_1c + 1 + local_20) {
        in_RSI[local_20] = 0;
      }
      local_14 = local_14 + 1;
    }
  }
  while (local_1c = iVar1, local_1c < in_EDI) {
    if (in_RSI[local_1c] == 1) {
      local_14 = local_14 + 1;
    }
    iVar1 = local_1c + 1;
  }
  return local_14;
}

Assistant:

int sieve(intvector ones) {
    int k = 0;
    int sp = floor(sqrt(ones.x));
    int i, j;
    ones.v[0] = NP; // 1 is not prime, though sometimes I wish it was
    for (i = 1; i < sp; i++) {
        if PRIME(ones.v[i]) {
            for (j = i + i + 1; j < ones.x; j += i + 1)
                ones.v[j] = NP;
            k++;
        }
    }
    for (i = sp; i < ones.x; i++) { // now we're only counting
        if PRIME(ones.v[i])
            k++;
    }
    return(k);
}